

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error handleUnknownEncoding(XML_Parser parser,XML_Char *encodingName)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  XML_Error XVar4;
  code *pcVar5;
  undefined1 local_440 [1024];
  undefined8 local_40;
  undefined8 uStack_38;
  code *local_30;
  
  pcVar5 = *(code **)((long)parser + 0xf0);
  if (pcVar5 == (code *)0x0) {
    return XML_ERROR_UNKNOWN_ENCODING;
  }
  memset(local_440,0xff,0x400);
  local_40 = 0;
  uStack_38 = 0;
  local_30 = (code *)0x0;
  iVar2 = (*pcVar5)(*(undefined8 *)((long)parser + 0x1e0),encodingName,local_440);
  if (iVar2 != 0) {
    pcVar5 = *(code **)((long)parser + 0x18);
    iVar2 = cm_expat_XmlSizeOfUnknownEncoding();
    lVar3 = (*pcVar5)((long)iVar2);
    *(long *)((long)parser + 0x1d0) = lVar3;
    if (lVar3 == 0) {
      parser = &DAT_00000001;
      if (local_30 != (code *)0x0) {
        (*local_30)(local_40);
      }
LAB_0014e249:
      bVar1 = false;
    }
    else {
      if (*(int *)((long)parser + 0x1c8) == 0) {
        pcVar5 = cm_expat_XmlInitUnknownEncoding;
      }
      else {
        pcVar5 = cm_expat_XmlInitUnknownEncodingNS;
      }
      lVar3 = (*pcVar5)(lVar3,local_440,uStack_38,local_40);
      if (lVar3 != 0) {
        *(undefined8 *)((long)parser + 0x1d8) = local_40;
        *(code **)((long)parser + 0x1e8) = local_30;
        *(long *)((long)parser + 0x118) = lVar3;
        parser = (undefined1 *)0x0;
        goto LAB_0014e249;
      }
      bVar1 = true;
    }
    XVar4 = (XML_Error)parser;
    if (!bVar1) {
      bVar1 = false;
      goto LAB_0014e271;
    }
  }
  XVar4 = (XML_Error)parser;
  bVar1 = true;
  if (local_30 != (code *)0x0) {
    (*local_30)(local_40);
  }
LAB_0014e271:
  if (bVar1) {
    return XML_ERROR_UNKNOWN_ENCODING;
  }
  return XVar4;
}

Assistant:

static enum XML_Error
handleUnknownEncoding(XML_Parser parser, const XML_Char *encodingName)
{
  if (unknownEncodingHandler) {
    XML_Encoding info;
    int i;
    for (i = 0; i < 256; i++)
      info.map[i] = -1;
    info.convert = 0;
    info.data = 0;
    info.release = 0;
    if (unknownEncodingHandler(unknownEncodingHandlerData, encodingName, &info)) {
      ENCODING *enc;
      unknownEncodingMem = MALLOC(XmlSizeOfUnknownEncoding());
      if (!unknownEncodingMem) {
        if (info.release)
          info.release(info.data);
        return XML_ERROR_NO_MEMORY;
      }
      enc = (ns
             ? XmlInitUnknownEncodingNS
             : XmlInitUnknownEncoding)(unknownEncodingMem,
                                       info.map,
                                       info.convert,
                                       info.data);
      if (enc) {
        unknownEncodingData = info.data;
        unknownEncodingRelease = info.release;
        encoding = enc;
        return XML_ERROR_NONE;
      }
    }
    if (info.release)
      info.release(info.data);
  }
  return XML_ERROR_UNKNOWN_ENCODING;
}